

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::UnsafeArenaSwap(Reflection *this,Message *lhs,Message *rhs)

{
  ReflectionSchema *this_00;
  uint uVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  ulong uVar10;
  int iVar11;
  FieldDescriptor *field;
  ulong uVar12;
  long lVar13;
  int i;
  long lVar14;
  
  if (lhs != rhs) {
    uVar7 = (ulong)(uint)(this->schema_).metadata_offset_;
    uVar2 = *(undefined8 *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar7);
    *(undefined8 *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar7) =
         *(undefined8 *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar7);
    *(undefined8 *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + uVar7) = uVar2;
    this_00 = &this->schema_;
    lVar13 = 0;
    for (lVar14 = 0; lVar14 <= this->last_non_weak_field_index_; lVar14 = lVar14 + 1) {
      field = (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x28) + lVar13);
      bVar4 = internal::ReflectionSchema::InRealOneof(this_00,field);
      if (!bVar4) {
        UnsafeShallowSwapField(this,lhs,rhs,field);
      }
      lVar13 = lVar13 + 0x48;
    }
    uVar1 = *(uint *)(this->descriptor_ + 0x68);
    uVar12 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar12;
    }
    for (; uVar7 * 0x28 - uVar12 != 0; uVar12 = uVar12 + 0x28) {
      lVar13 = *(long *)(this->descriptor_ + 0x30);
      if ((*(int *)(lVar13 + 4 + uVar12) != 1) ||
         ((*(byte *)(*(long *)(lVar13 + 0x20 + uVar12) + 1) & 2) == 0)) {
        SwapOneofField<true>(this,lhs,rhs,(OneofDescriptor *)(lVar13 + uVar12));
      }
    }
    if ((this->schema_).has_bits_offset_ != -1) {
      puVar8 = MutableHasBits(this,lhs);
      puVar9 = MutableHasBits(this,rhs);
      lVar13 = 0;
      iVar11 = 0;
      for (lVar14 = 0; lVar14 < *(int *)(this->descriptor_ + 4); lVar14 = lVar14 + 1) {
        lVar3 = *(long *)(this->descriptor_ + 0x28);
        if ((~*(byte *)(lVar3 + 1 + lVar13) & 0x60) != 0) {
          bVar4 = internal::ReflectionSchema::InRealOneof
                            (this_00,(FieldDescriptor *)(lVar3 + lVar13));
          iVar11 = iVar11 + (uint)!bVar4;
        }
        lVar13 = lVar13 + 0x48;
      }
      uVar7 = (long)(iVar11 + 0x1f) / 0x20;
      uVar12 = uVar7 & 0xffffffff;
      uVar10 = 0;
      if ((int)uVar7 < 1) {
        uVar12 = 0;
      }
      for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        uVar5 = puVar8[uVar10];
        puVar8[uVar10] = puVar9[uVar10];
        puVar9[uVar10] = uVar5;
      }
    }
    if ((this->schema_).extensions_offset_ != -1) {
      uVar5 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
      uVar6 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
      internal::ExtensionSet::InternalSwap
                ((ExtensionSet *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
                 (ExtensionSet *)((long)&(rhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar6))
      ;
      return;
    }
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaSwap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  MutableInternalMetadata(lhs)->InternalSwap(MutableInternalMetadata(rhs));

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (schema_.InRealOneof(field)) continue;
    if (schema_.IsFieldStripped(field)) continue;
    UnsafeShallowSwapField(lhs, rhs, field);
  }
  const int oneof_decl_count = descriptor_->oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    if (!oneof->is_synthetic()) {
      SwapOneofField<true>(lhs, rhs, oneof);
    }
  }

  // Swapping bits need to happen after swapping fields, because the latter may
  // depend on the has bit information.
  if (schema_.HasHasbits()) {
    uint32* lhs_has_bits = MutableHasBits(lhs);
    uint32* rhs_has_bits = MutableHasBits(rhs);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->is_repeated() || schema_.InRealOneof(field)) {
        continue;
      }
      fields_with_has_bits++;
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(lhs_has_bits[i], rhs_has_bits[i]);
    }
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(lhs)->InternalSwap(MutableExtensionSet(rhs));
  }
}